

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O2

long testReadFromQuoteRequest(int count)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  uint num;
  bool bVar5;
  QuoteReqID quoteReqID;
  Symbol symbol;
  NoRelatedSym group;
  StrikePrice strikePrice;
  PutOrCall putOrCall;
  MaturityMonthYear maturityMonthYear;
  Currency currency;
  NoRelatedSym noRelatedSym;
  OrdType ordType;
  OrderQty orderQty;
  Side side;
  QuoteRequest message;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&quoteReqID,"1",(allocator<char> *)&symbol);
  FIX::QuoteReqID::QuoteReqID((QuoteReqID *)&group,(STRING *)&quoteReqID);
  FIX42::QuoteRequest::QuoteRequest(&message,(QuoteReqID *)&group);
  FIX::FieldBase::~FieldBase((FieldBase *)&group);
  std::__cxx11::string::~string((string *)&quoteReqID);
  FIX42::QuoteRequest::NoRelatedSym::NoRelatedSym(&group);
  iVar4 = 10;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&symbol,"IBM",(allocator<char> *)&maturityMonthYear);
    FIX::Symbol::Symbol((Symbol *)&quoteReqID,(STRING *)&symbol);
    FIX42::QuoteRequest::NoRelatedSym::set((NoRelatedSym *)&group.super_Group,(Symbol *)&quoteReqID)
    ;
    FIX::FieldBase::~FieldBase((FieldBase *)&quoteReqID);
    std::__cxx11::string::~string((string *)&symbol);
    FIX::MaturityMonthYear::MaturityMonthYear((MaturityMonthYear *)&quoteReqID);
    FIX42::QuoteRequest::NoRelatedSym::set
              ((NoRelatedSym *)&group.super_Group,(MaturityMonthYear *)&quoteReqID);
    FIX::FieldBase::~FieldBase((FieldBase *)&quoteReqID);
    FIX::PutOrCall::PutOrCall((PutOrCall *)&quoteReqID,0);
    FIX42::QuoteRequest::NoRelatedSym::set
              ((NoRelatedSym *)&group.super_Group,(PutOrCall *)&quoteReqID);
    FIX::FieldBase::~FieldBase((FieldBase *)&quoteReqID);
    symbol.super_StringField.super_FieldBase._vptr_FieldBase = (_func_int **)0x405e000000000000;
    FIX::StrikePrice::StrikePrice((StrikePrice *)&quoteReqID,(PRICE *)&symbol);
    FIX42::QuoteRequest::NoRelatedSym::set
              ((NoRelatedSym *)&group.super_Group,(StrikePrice *)&quoteReqID);
    FIX::FieldBase::~FieldBase((FieldBase *)&quoteReqID);
    FIX::Side::Side((Side *)&quoteReqID,"11FIX.4.2");
    FIX42::QuoteRequest::NoRelatedSym::set((NoRelatedSym *)&group.super_Group,(Side *)&quoteReqID);
    FIX::FieldBase::~FieldBase((FieldBase *)&quoteReqID);
    symbol.super_StringField.super_FieldBase._vptr_FieldBase = (_func_int **)0x4059000000000000;
    FIX::OrderQty::OrderQty((OrderQty *)&quoteReqID,(QTY *)&symbol);
    FIX42::QuoteRequest::NoRelatedSym::set
              ((NoRelatedSym *)&group.super_Group,(OrderQty *)&quoteReqID);
    FIX::FieldBase::~FieldBase((FieldBase *)&quoteReqID);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&symbol,"USD",(allocator<char> *)&maturityMonthYear);
    FIX::Currency::Currency((Currency *)&quoteReqID,(STRING *)&symbol);
    FIX42::QuoteRequest::NoRelatedSym::set
              ((NoRelatedSym *)&group.super_Group,(Currency *)&quoteReqID);
    FIX::FieldBase::~FieldBase((FieldBase *)&quoteReqID);
    std::__cxx11::string::~string((string *)&symbol);
    FIX::OrdType::OrdType((OrdType *)&quoteReqID,"1FIX.4.2");
    FIX42::QuoteRequest::NoRelatedSym::set
              ((NoRelatedSym *)&group.super_Group,(OrdType *)&quoteReqID);
    FIX::FieldBase::~FieldBase((FieldBase *)&quoteReqID);
    FIX::Message::addGroup((Message *)&message,&group.super_Group);
  }
  FIX::FieldMap::clear();
  lVar2 = GetTickCount();
  if (count < 1) {
    count = 0;
  }
  for (iVar4 = 0; iVar4 != count; iVar4 = iVar4 + 1) {
    FIX::QuoteReqID::QuoteReqID(&quoteReqID);
    FIX::Symbol::Symbol(&symbol);
    FIX::MaturityMonthYear::MaturityMonthYear(&maturityMonthYear);
    FIX::PutOrCall::PutOrCall(&putOrCall);
    FIX::StrikePrice::StrikePrice(&strikePrice);
    FIX::Side::Side(&side);
    FIX::OrderQty::OrderQty(&orderQty);
    FIX::Currency::Currency(&currency);
    FIX::OrdType::OrdType(&ordType);
    FIX::NoRelatedSym::NoRelatedSym(&noRelatedSym);
    FIX::FieldMap::getField((FieldMap *)&message,(FieldBase *)&noRelatedSym);
    iVar1 = FIX::IntField::getValue((IntField *)&noRelatedSym);
    if (iVar1 < 1) {
      iVar1 = 0;
    }
    for (num = 1; num - iVar1 != 1; num = num + 1) {
      FIX::Message::getGroup((Message *)&message,num,&group.super_Group);
      FIX::FieldMap::getField(&group.super_Group.super_FieldMap,(FieldBase *)&symbol);
      FIX::FieldMap::getField(&group.super_Group.super_FieldMap,(FieldBase *)&maturityMonthYear);
      FIX::FieldMap::getField(&group.super_Group.super_FieldMap,(FieldBase *)&putOrCall);
      FIX::FieldMap::getField(&group.super_Group.super_FieldMap,(FieldBase *)&strikePrice);
      FIX::FieldMap::getField(&group.super_Group.super_FieldMap,(FieldBase *)&side);
      FIX::FieldMap::getField(&group.super_Group.super_FieldMap,(FieldBase *)&orderQty);
      FIX::FieldMap::getField(&group.super_Group.super_FieldMap,(FieldBase *)&currency);
      FIX::FieldMap::getField(&group.super_Group.super_FieldMap,(FieldBase *)&ordType);
      FIX::IntField::getValue(&putOrCall.super_IntField);
      FIX::DoubleField::getValue(&strikePrice.super_PriceField);
      FIX::CharField::getValue((CharField *)&side);
      FIX::DoubleField::getValue((DoubleField *)&orderQty);
      FIX::CharField::getValue((CharField *)&ordType);
    }
    FIX::FieldBase::~FieldBase((FieldBase *)&noRelatedSym);
    FIX::FieldBase::~FieldBase((FieldBase *)&ordType);
    FIX::FieldBase::~FieldBase((FieldBase *)&currency);
    FIX::FieldBase::~FieldBase((FieldBase *)&orderQty);
    FIX::FieldBase::~FieldBase((FieldBase *)&side);
    FIX::FieldBase::~FieldBase((FieldBase *)&strikePrice);
    FIX::FieldBase::~FieldBase((FieldBase *)&putOrCall);
    FIX::FieldBase::~FieldBase((FieldBase *)&maturityMonthYear);
    FIX::FieldBase::~FieldBase((FieldBase *)&symbol);
    FIX::FieldBase::~FieldBase((FieldBase *)&quoteReqID);
  }
  lVar3 = GetTickCount();
  FIX::FieldMap::~FieldMap((FieldMap *)&group);
  FIX::Message::~Message((Message *)&message);
  return lVar3 - lVar2;
}

Assistant:

long testReadFromQuoteRequest(int count) {
  count = count - 1;

  FIX42::QuoteRequest message(FIX::QuoteReqID("1"));
  FIX42::QuoteRequest::NoRelatedSym group;

  for (int i = 1; i <= 10; ++i) {
    group.set(FIX::Symbol("IBM"));
    group.set(FIX::MaturityMonthYear());
    group.set(FIX::PutOrCall(FIX::PutOrCall_PUT));
    group.set(FIX::StrikePrice(120));
    group.set(FIX::Side(FIX::Side_BUY));
    group.set(FIX::OrderQty(100));
    group.set(FIX::Currency("USD"));
    group.set(FIX::OrdType(FIX::OrdType_MARKET));
    message.addGroup(group);
  }
  group.clear();

  long start = GetTickCount();
  for (int j = 0; j <= count; ++j) {
    FIX::QuoteReqID quoteReqID;
    FIX::Symbol symbol;
    FIX::MaturityMonthYear maturityMonthYear;
    FIX::PutOrCall putOrCall;
    FIX::StrikePrice strikePrice;
    FIX::Side side;
    FIX::OrderQty orderQty;
    FIX::Currency currency;
    FIX::OrdType ordType;

    FIX::NoRelatedSym noRelatedSym;
    message.get(noRelatedSym);
    int end = noRelatedSym;
    for (int k = 1; k <= end; ++k) {
      message.getGroup(k, group);
      group.get(symbol);
      group.get(maturityMonthYear);
      group.get(putOrCall);
      group.get(strikePrice);
      group.get(side);
      group.get(orderQty);
      group.get(currency);
      group.get(ordType);
      maturityMonthYear.getValue();
      putOrCall.getValue();
      strikePrice.getValue();
      side.getValue();
      orderQty.getValue();
      currency.getValue();
      ordType.getValue();
    }
  }

  return GetTickCount() - start;
}